

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.c
# Opt level: O0

int TestSuite_Run(TestSuite *suite)

{
  int local_1c;
  int failures;
  TestSuite *suite_local;
  
  local_1c = 0;
  if ((suite->flags & 4U) == 0) {
    TestSuite_PrintJsonHeader(suite,_stdout);
    if (suite->outfile != (FILE *)0x0) {
      TestSuite_PrintJsonHeader(suite,suite->outfile);
    }
    if (suite->tests == (Test *)0x0) {
      TestSuite_PrintJsonFooter(_stdout);
      if (suite->outfile != (FILE *)0x0) {
        TestSuite_PrintJsonFooter(suite->outfile);
      }
    }
    else if (suite->testname == (char *)0x0) {
      if ((suite->flags & 8U) == 0) {
        local_1c = TestSuite_RunSerial(suite);
      }
      else {
        TestSuite_RunParallel(suite);
      }
    }
    else {
      local_1c = TestSuite_RunNamed(suite,suite->testname);
    }
    suite_local._4_4_ = local_1c;
  }
  else {
    TestSuite_PrintHelp(suite,_stderr);
    suite_local._4_4_ = 0;
  }
  return suite_local._4_4_;
}

Assistant:

int
TestSuite_Run (TestSuite *suite) /* IN */
{
   int failures = 0;

   if ((suite->flags & TEST_HELPONLY)) {
      TestSuite_PrintHelp (suite, stderr);
      return 0;
   }

   TestSuite_PrintJsonHeader (suite, stdout);
   if (suite->outfile) {
      TestSuite_PrintJsonHeader (suite, suite->outfile);
   }

   if (suite->tests) {
      if (suite->testname) {
         failures += TestSuite_RunNamed (suite, suite->testname);
      } else if ((suite->flags & TEST_THREADS)) {
         TestSuite_RunParallel (suite);
      } else {
         failures += TestSuite_RunSerial (suite);
      }
   } else {
      TestSuite_PrintJsonFooter (stdout);
      if (suite->outfile) {
         TestSuite_PrintJsonFooter (suite->outfile);
      }
   }

   return failures;
}